

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void dynet::TensorTools::logsumexp_dev<dynet::Device_CPU>
               (Device_CPU *dev,Tensor *x,Tensor *m,Tensor *z)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  size_t b;
  ulong uVar3;
  uint uVar4;
  float *pfVar5;
  real rVar6;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_f0;
  ulong local_c8;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_b8;
  DefaultDevice *local_98;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> *local_90;
  undefined1 local_88 [16];
  long local_78;
  ulong uStack_70;
  undefined8 local_68;
  ulong local_60;
  ulong local_58;
  bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_> local_48;
  
  if (((x->d).bd == 1) && (((x->d).nd < 2 || ((x->d).d[1] == 1)))) {
    local_88 = (undefined1  [16])Tensor::t<1>(x);
    local_b8.m_data = m->v;
    local_f0.m_dimensions.super_array<long,_3>._M_elems[0] = (long)&local_b8;
    local_f0.m_data = (StoragePointerType)dev->edevice;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_f0,
                (TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>
                 *)local_88);
    rVar6 = as_scalar(m);
    local_88 = (undefined1  [16])Tensor::t<1>(x);
    local_78 = CONCAT44(local_78._4_4_,rVar6);
    local_b8.m_data = z->v;
    local_f0.m_data = (StoragePointerType)dev->edevice;
    local_f0.m_dimensions.super_array<long,_3>._M_elems[0] = (long)&local_b8;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_f0,
                (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>
                 *)local_88);
    local_b8.m_data = z->v;
    local_88._0_8_ = local_b8.m_data;
    uStack_70 = CONCAT44(uStack_70._4_4_,rVar6);
    local_f0.m_data = (StoragePointerType)dev->edevice;
    local_f0.m_dimensions.super_array<long,_3>._M_elems[0] = (long)&local_b8;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_f0,
                (TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>_>
                 *)local_88);
  }
  else {
    Tensor::tb<2>(&local_f0,x);
    local_78 = local_f0.m_dimensions.super_array<long,_3>._M_elems[1];
    uStack_70 = local_f0.m_dimensions.super_array<long,_3>._M_elems[2];
    local_88._8_8_ = local_f0.m_dimensions.super_array<long,_3>._M_elems[0];
    local_88._0_8_ = local_f0.m_data;
    local_68 = (ulong)local_68._4_4_ << 0x20;
    local_b8.m_data = m->v;
    uVar4 = 1;
    if ((m->d).nd != 0) {
      uVar4 = (m->d).d[0];
    }
    local_b8.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)uVar4;
    local_b8.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)(m->d).bd;
    local_90 = &local_b8;
    local_98 = dev->edevice;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_98,
                (TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>
                 *)local_88);
    pfVar5 = m->v;
    for (uVar3 = 0; uVar3 < (x->d).bd; uVar3 = uVar3 + 1) {
      uVar2 = 0;
      while( true ) {
        uVar4 = 1;
        uVar1 = (ulong)(x->d).d[1];
        if ((x->d).nd < 2) {
          uVar1 = 1;
        }
        if (uVar1 <= uVar2) break;
        Tensor::tb<2>(&local_b8,x);
        local_48.m_value = *pfVar5;
        local_78 = local_b8.m_dimensions.super_array<long,_3>._M_elems[1];
        uStack_70 = local_b8.m_dimensions.super_array<long,_3>._M_elems[2];
        local_88._0_8_ = local_b8.m_data;
        local_88._8_8_ = local_b8.m_dimensions.super_array<long,_3>._M_elems[0];
        if ((z->d).nd != 0) {
          uVar4 = (z->d).d[0];
        }
        local_f0.m_data = z->v;
        local_f0.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)uVar4;
        local_f0.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)(z->d).bd;
        local_98 = dev->edevice;
        local_90 = &local_f0;
        local_f0.m_dimensions.super_array<long,_3>._M_elems[2] = uVar3;
        local_c8 = uVar2;
        local_68 = uVar3;
        local_58 = uVar2;
        Eigen::
        TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>>,Eigen::DefaultDevice>
        ::operator=((TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>>,Eigen::DefaultDevice>
                     *)&local_98,
                    (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::MakePointer>
                     *)local_88);
        local_f0.m_data = z->v;
        uVar4 = 1;
        if ((z->d).nd != 0) {
          uVar4 = (z->d).d[0];
        }
        local_f0.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)uVar4;
        local_f0.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)(z->d).bd;
        local_48.m_value = *pfVar5;
        local_88._8_8_ = local_f0.m_dimensions.super_array<long,_3>._M_elems[0];
        local_88._0_8_ = local_f0.m_data;
        local_b8.m_data = (StoragePointerType)dev->edevice;
        local_b8.m_dimensions.super_array<long,_3>._M_elems[0] = (long)&local_f0;
        local_f0.m_dimensions.super_array<long,_3>._M_elems[2] = uVar3;
        local_c8 = uVar2;
        local_78 = local_f0.m_dimensions.super_array<long,_3>._M_elems[1];
        uStack_70 = uVar3;
        local_60 = uVar2;
        Eigen::
        TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>>,Eigen::DefaultDevice>
        ::operator=((TensorDevice<Eigen::TensorChippingOp<0l,Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>>,Eigen::DefaultDevice>
                     *)&local_b8,
                    (TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>
                     *)local_88);
        uVar2 = uVar2 + 1;
        pfVar5 = pfVar5 + 1;
      }
    }
  }
  return;
}

Assistant:

void TensorTools::logsumexp_dev(const MyDevice & dev, const Tensor& x, Tensor & m, Tensor& z) {
  if(x.d.bd == 1 && x.d[1] == 1) {
    m.t<0>().device(*dev.edevice) = x.t<1>().maximum();
#ifdef __CUDACC__
    Eigen::array<int, 1> bcast;
    bcast[0] = x.d[0];
    // This needs to be split into two lines to prevent memory allocation
    // TODO? Here and in logsoftmax: Is there a better way to subtract a scalar that is already on the GPU without using broadcasting (and without copying the scalar back to the host first)
    z.t<0>().device(*dev.edevice) = (x.t<1>() - m.t<1>().broadcast(bcast)).exp().sum();
    z.t<0>().device(*dev.edevice) = z.t<0>().log() + m.t<0>();
#else
    float mval = as_scalar(m);
    // This needs to be split into two lines to prevent memory allocation
    z.t<0>().device(*dev.edevice) = (x.t<1>() - mval).exp().sum();
    z.t<0>().device(*dev.edevice) = z.t<0>().log() + mval;
#endif
  } else {
    Eigen::array<int, 1> red_axis; red_axis[0] = 0;
    m.tb<1>().device(*dev.edevice) = x.tb<2>().maximum(red_axis);
    // TODO: Currently, the first version is slower on CPU, hence the switch
#ifdef __CUDACC__
    Eigen::array<int, 3> bcast({(int)x.d.rows(), 1, 1});
    Eigen::array<int, 3> morph({1, (int)m.d[0], (int)m.d.bd});
    // This needs to be split into two lines to prevent memory allocation
    z.tb<1>().device(*dev.edevice) = (x.tb<2>() - m.tb<2>().reshape(morph).broadcast(bcast)).exp().sum(red_axis);
    z.tb<1>().device(*dev.edevice) = z.tb<1>().log() + m.tb<1>();
#else
    auto miter = m.v;
    for(size_t b = 0; b < x.d.bd; ++b) {
      for(size_t i = 0; i < x.d[1]; ++i, ++miter) {
        z.tb<1>().chip<1>(b).chip<0>(i).device(*dev.edevice) = (x.tb<2>().chip<2>(b).chip<1>(i) - *miter).exp().sum();
        z.tb<1>().chip<1>(b).chip<0>(i).device(*dev.edevice) = z.tb<1>().chip<1>(b).chip<0>(i).log() + *miter;
      }
    }
#endif
  }
}